

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taggedptr.h
# Opt level: O0

optional<pbrt::ShapeIntersection> * __thiscall
pbrt::detail::DispatchSplitCPU<6>::operator()
          (void *param_1,undefined8 param_2,undefined8 param_3,undefined8 param_4,
          TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
          *param_5,int param_6)

{
  int mid;
  TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
  local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined1 local_5a [2];
  TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
  local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined1 local_39;
  undefined4 local_38;
  int local_34;
  TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
  *local_30;
  undefined8 local_28;
  undefined8 local_18;
  undefined8 local_10;
  void *local_8;
  
  local_38 = 3;
  local_34 = param_6;
  local_30 = param_5;
  local_28 = param_2;
  local_18 = param_3;
  local_10 = param_4;
  local_8 = param_1;
  if (param_6 + -1 < 3) {
    local_50 = param_3;
    local_48 = param_4;
    TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
    ::TaggedPointer(&local_58,param_5);
    DispatchSplitCPU<3>::operator()
              ((DispatchSplitCPU<3> *)param_1,&local_39,local_50,local_48,&local_58,local_34);
  }
  else {
    local_70 = param_3;
    local_68 = param_4;
    TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
    ::TaggedPointer(&local_78,param_5);
    DispatchSplitCPU<3>::operator()
              ((DispatchSplitCPU<3> *)param_1,local_5a,local_70,local_68,&local_78,local_34 + -3);
  }
  return (optional<pbrt::ShapeIntersection> *)param_1;
}

Assistant:

inline auto operator()(F func, Tp tp, int tag, TypePack<Ts...> types) {
        constexpr int mid = n / 2;

        if (tag - 1 < mid)  // 0-based indexing here to be more traditional
            return DispatchSplitCPU<mid>()(
                func, tp, tag, typename TakeFirstN<mid, TypePack<Ts...>>::type());
        else
            return DispatchSplitCPU<n - mid>()(
                func, tp, tag - mid, typename RemoveFirstN<mid, TypePack<Ts...>>::type());
    }